

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O2

int CsvHelper::read_string(char *text,int text_max,size_t start,char *buffer,size_t buffer_max)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  
  uVar2 = start;
  if (start < buffer_max) {
    uVar2 = buffer_max;
  }
  for (; start < buffer_max; start = start + 1) {
    cVar4 = buffer[start];
    if ((cVar4 != '\t') && (cVar4 != ' ')) {
      uVar2 = start;
      if (cVar4 == '\"') {
        uVar1 = start + 1;
        iVar3 = 0;
        goto LAB_001a1590;
      }
      break;
    }
  }
  iVar3 = 0;
  for (; ((uVar2 < buffer_max && (cVar4 = buffer[uVar2], cVar4 != '\0')) && (cVar4 != ','));
      uVar2 = uVar2 + 1) {
    if (iVar3 < text_max + -1) {
      text[iVar3] = cVar4;
      iVar3 = iVar3 + 1;
    }
  }
LAB_001a1608:
  text[iVar3] = '\0';
  uVar1 = buffer_max;
  if (buffer_max < uVar2) {
    uVar1 = uVar2;
  }
  do {
    if (buffer_max <= uVar2) {
LAB_001a163e:
      return (int)uVar1;
    }
    cVar4 = buffer[uVar2];
    if ((cVar4 != '\t') && (cVar4 != ' ')) {
      uVar1 = uVar2;
      if (cVar4 == ',') {
        uVar1 = uVar2 + 1;
      }
      goto LAB_001a163e;
    }
    uVar2 = uVar2 + 1;
  } while( true );
LAB_001a1590:
  uVar2 = uVar1;
  if (buffer_max <= uVar1) goto LAB_001a1608;
  cVar4 = buffer[uVar1];
  if (cVar4 == '\"') {
    uVar2 = uVar1 + 1;
    if ((buffer_max <= uVar2) || (buffer[uVar2] != '\"')) goto LAB_001a1608;
    cVar4 = '\"';
    lVar5 = 2;
    if (iVar3 < text_max + -1) goto LAB_001a15c7;
    lVar5 = 2;
  }
  else {
    if (cVar4 == '\0') goto LAB_001a1608;
    lVar5 = 1;
    if (iVar3 < text_max + -1) {
LAB_001a15c7:
      text[iVar3] = cVar4;
      iVar3 = iVar3 + 1;
    }
    else {
      lVar5 = 1;
    }
  }
  uVar1 = uVar1 + lVar5;
  goto LAB_001a1590;
}

Assistant:

int CsvHelper::read_string(char* text, int text_max, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;

    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, copy quoted, else copy */
    if (start < buffer_max && buffer[start] == '"')
    {
#if 0
        if (x < (text_max - 1))
        {
            text[x] = buffer[start];
            x++;
        }
#endif
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
#if 0
                /* Copy the quote and skip it. */
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
#endif
                start++;
                /* Test whether there is a double quote */
                if (start < buffer_max && buffer[start] == '"')
                {
                    /* copy the double quote and continue */
                    if (x < (text_max - 1))
                    {
                        text[x] = buffer[start];
                        x++;
                    }
                    start++;
                }
                else
                {
                    /* This was the final quote */
                    break;
                }
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}